

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O3

PHYSFS_File * doOpenWrite(char *_fname,int appending)

{
  void *pvVar1;
  _func_PHYSFS_Io_ptr_void_ptr_char_ptr *p_Var2;
  _func_void_PHYSFS_Io_ptr *p_Var3;
  DirHandle *h;
  long *plVar4;
  int iVar5;
  size_t sVar6;
  long *plVar7;
  long lVar8;
  PHYSFS_Io *pPVar9;
  FileHandle *pFVar10;
  size_t sVar11;
  void **retval;
  long *plVar12;
  PHYSFS_ErrorCode errcode;
  long lStack_38;
  long *local_30;
  char *arcfname;
  
  plVar12 = &lStack_38;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    return (PHYSFS_File *)0x0;
  }
  __PHYSFS_platformGrabMutex(stateLock);
  h = writeDir;
  if (writeDir == (DirHandle *)0x0) {
    errcode = PHYSFS_ERR_NO_WRITE_DIR;
LAB_001095c6:
    PHYSFS_setErrorCode(errcode);
    __PHYSFS_platformReleaseMutex(stateLock);
    return (PHYSFS_File *)0x0;
  }
  sVar6 = strlen(_fname);
  sVar11 = h->rootlen;
  if (sVar6 + sVar11 + 1 < 0x100) {
    plVar7 = (long *)((long)&lStack_38 - (sVar11 + sVar6 + 0x18 & 0xfffffffffffffff0));
    lVar8 = 0;
    plVar12 = plVar7;
  }
  else {
    plVar7 = (long *)(*__PHYSFS_AllocatorHooks.Malloc)(sVar11 + sVar6 + 9);
    if (plVar7 == (long *)0x0) {
      errcode = PHYSFS_ERR_OUT_OF_MEMORY;
      goto LAB_001095c6;
    }
    sVar11 = h->rootlen;
    lVar8 = 1;
  }
  *plVar7 = lVar8;
  plVar12[-1] = 0x10953c;
  iVar5 = sanitizePlatformIndependentPath(_fname,(char *)((long)plVar7 + sVar11 + 8));
  if (iVar5 != 0) {
    local_30 = plVar7 + 1;
    pFVar10 = (FileHandle *)0x0;
    plVar12[-1] = 0x10955c;
    iVar5 = verifyPath(h,(char **)&local_30,0);
    plVar4 = local_30;
    if (iVar5 == 0) goto LAB_001095f0;
    pvVar1 = h->opaque;
    p_Var2 = (&h->funcs->openWrite)[appending != 0];
    plVar12[-1] = 0x10957b;
    pPVar9 = (*p_Var2)(pvVar1,(char *)plVar4);
    if (pPVar9 != (PHYSFS_Io *)0x0) {
      plVar12[-1] = 0x10958e;
      pFVar10 = (FileHandle *)(*__PHYSFS_AllocatorHooks.Malloc)(0x40);
      if (pFVar10 != (FileHandle *)0x0) {
        *(undefined8 *)&pFVar10->forReading = 0;
        pFVar10->dirHandle = (DirHandle *)0x0;
        pFVar10->buffill = 0;
        pFVar10->bufpos = 0;
        pFVar10->buffer = (PHYSFS_uint8 *)0x0;
        pFVar10->bufsize = 0;
        pFVar10->io = pPVar9;
        pFVar10->dirHandle = h;
        pFVar10->next = openWriteList;
        openWriteList = pFVar10;
        goto LAB_001095f0;
      }
      p_Var3 = pPVar9->destroy;
      plVar12[-1] = 0x1095e3;
      (*p_Var3)(pPVar9);
      plVar12[-1] = 0x1095ed;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    }
  }
  pFVar10 = (FileHandle *)0x0;
LAB_001095f0:
  plVar12[-1] = 0x1095fc;
  __PHYSFS_platformReleaseMutex(stateLock);
  if (*plVar7 != 0) {
    plVar12[-1] = 0x10960b;
    (*__PHYSFS_AllocatorHooks.Free)(plVar7);
    return (PHYSFS_File *)pFVar10;
  }
  return (PHYSFS_File *)pFVar10;
}

Assistant:

static PHYSFS_File *doOpenWrite(const char *_fname, const int appending)
{
    FileHandle *fh = NULL;
    DirHandle *h;
    size_t len;
    char *fname;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    __PHYSFS_platformGrabMutex(stateLock);

    h = writeDir;
    BAIL_IF_MUTEX(!h, PHYSFS_ERR_NO_WRITE_DIR, stateLock, 0);

    len = strlen(_fname) + dirHandleRootLen(h) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, 0);

    if (sanitizePlatformIndependentPathWithRoot(h, _fname, fname))
    {
        PHYSFS_Io *io = NULL;
        char *arcfname = fname;
        if (verifyPath(h, &arcfname, 0))
        {
            const PHYSFS_Archiver *f = h->funcs;
            if (appending)
                io = f->openAppend(h->opaque, arcfname);
            else
                io = f->openWrite(h->opaque, arcfname);

            if (io)
            {
                fh = (FileHandle *) allocator.Malloc(sizeof (FileHandle));
                if (fh == NULL)
                {
                    io->destroy(io);
                    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
                } /* if */
                else
                {
                    memset(fh, '\0', sizeof (FileHandle));
                    fh->io = io;
                    fh->dirHandle = h;
                    fh->next = openWriteList;
                    openWriteList = fh;
                } /* else */
            } /* if */
        } /* if */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);

    __PHYSFS_smallFree(fname);
    return ((PHYSFS_File *) fh);
}